

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_4_nz_map_contexts_hor(uint8_t *levels,int width,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 *in_RCX;
  int in_ESI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  int col;
  __m128i level [5];
  __m128i count;
  __m128i pos_to_offset;
  __m128i pos_to_offset_large;
  int stride;
  __m128i *in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe80;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int in_stack_fffffffffffffe8c;
  uint8_t *in_stack_fffffffffffffe90;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 *local_f0;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  
  uVar1 = 0x24;
  uVar2 = 0x24;
  uVar3 = 0x1a;
  local_118 = 0x1f1f1f1f1a1a1a1a;
  local_f0 = in_RCX;
  do {
    load_levels_4x4x5_sse2
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               (ptrdiff_t *)
               CONCAT44(in_ESI,CONCAT13(uVar3,CONCAT12(uVar2,CONCAT11(uVar1,
                                                  in_stack_fffffffffffffe80)))),
               in_stack_fffffffffffffe78);
    get_coeff_contexts_kernel_sse2((__m128i *)&stack0xfffffffffffffe88);
    local_a8 = (char)extraout_XMM0_Qa;
    cStack_a7 = (char)((ulong)extraout_XMM0_Qa >> 8);
    cStack_a6 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_a5 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
    cStack_a4 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_a3 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
    cStack_a2 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_a1 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
    cStack_a0 = (char)extraout_XMM0_Qb;
    cStack_9f = (char)((ulong)extraout_XMM0_Qb >> 8);
    cStack_9e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_9d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
    cStack_9c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_9b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
    cStack_9a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_99 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
    local_b8 = (char)local_118;
    cStack_b7 = (char)((ulong)local_118 >> 8);
    cStack_b6 = (char)((ulong)local_118 >> 0x10);
    cStack_b5 = (char)((ulong)local_118 >> 0x18);
    cStack_b4 = (char)((ulong)local_118 >> 0x20);
    cStack_b3 = (char)((ulong)local_118 >> 0x28);
    cStack_b2 = (char)((ulong)local_118 >> 0x30);
    cStack_b1 = (char)((ulong)local_118 >> 0x38);
    local_128 = CONCAT17(cStack_a1 + cStack_b1,
                         CONCAT16(cStack_a2 + cStack_b2,
                                  CONCAT15(cStack_a3 + cStack_b3,
                                           CONCAT14(cStack_a4 + cStack_b4,
                                                    CONCAT13(cStack_a5 + cStack_b5,
                                                             CONCAT12(cStack_a6 + cStack_b6,
                                                                      CONCAT11(cStack_a7 + cStack_b7
                                                                               ,local_a8 + local_b8)
                                                                     ))))));
    uStack_120 = CONCAT17(cStack_99 + '$',
                          CONCAT16(cStack_9a + '$',
                                   CONCAT15(cStack_9b + '$',
                                            CONCAT14(cStack_9c + '$',
                                                     CONCAT13(cStack_9d + '$',
                                                              CONCAT12(cStack_9e + '$',
                                                                       CONCAT11(cStack_9f + '$',
                                                                                cStack_a0 + '$')))))
                                  ));
    *local_f0 = local_128;
    local_f0[1] = uStack_120;
    local_f0 = local_f0 + 2;
    in_ESI = in_ESI + -4;
    local_118 = 0x2424242424242424;
  } while (in_ESI != 0);
  return;
}

Assistant:

static inline void get_4_nz_map_contexts_hor(const uint8_t *levels,
                                             const int width,
                                             const ptrdiff_t *const offsets,
                                             int8_t *coeff_contexts) {
  const int stride = 4 + TX_PAD_HOR;
  const __m128i pos_to_offset_large = _mm_set1_epi8(SIG_COEF_CONTEXTS_2D + 10);
  __m128i pos_to_offset =
      _mm_setr_epi8(SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 0,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 0,
                    SIG_COEF_CONTEXTS_2D + 5, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 5, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10);
  __m128i count;
  __m128i level[5];
  int col = width;

  assert(!(width % 4));

  do {
    load_levels_4x4x5_sse2(levels, stride, offsets, level);
    count = get_coeff_contexts_kernel_sse2(level);
    count = _mm_add_epi8(count, pos_to_offset);
    _mm_store_si128((__m128i *)coeff_contexts, count);
    pos_to_offset = pos_to_offset_large;
    levels += 4 * stride;
    coeff_contexts += 16;
    col -= 4;
  } while (col);
}